

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_setdebt(global_State *g,l_mem debt)

{
  long lVar1;
  l_mem tb;
  l_mem debt_local;
  global_State *g_local;
  
  lVar1 = g->totalbytes + g->GCdebt;
  tb = debt;
  if (debt < lVar1 + -0x7fffffffffffffff) {
    tb = lVar1 + -0x7fffffffffffffff;
  }
  g->totalbytes = lVar1 - tb;
  g->GCdebt = tb;
  return;
}

Assistant:

void luaE_setdebt(global_State *g, l_mem debt) {
    l_mem tb = gettotalbytes(g);
    lua_assert(tb > 0);
    if (debt < tb - MAX_LMEM)
        debt = tb - MAX_LMEM;  /* will make 'totalbytes == MAX_LMEM' */
    g->totalbytes = tb - debt;
    g->GCdebt = debt;
}